

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_resolve_thenable_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  JSValue JVar2;
  JSValue new_target;
  int iVar3;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar4;
  JSValue args [2];
  uint uStack_74;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar2 = argv[1];
  JVar4 = argv[2];
  iVar3 = js_create_resolving_functions(ctx,(JSValue *)&local_68,*argv);
  if (iVar3 < 0) {
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    new_target.tag = 3;
    new_target.u.ptr = (void *)((ulong)uStack_74 << 0x20);
    JVar4 = JS_CallInternal(ctx,JVar4,JVar2,new_target,2,(JSValue *)&local_68,2);
    if ((int)JVar4.tag == 6) {
      pJVar1 = ctx->rt;
      local_48 = (JSValueUnion)(pJVar1->current_exception).u.ptr;
      iStack_40 = (pJVar1->current_exception).tag;
      (pJVar1->current_exception).u.int32 = 0;
      (pJVar1->current_exception).tag = 2;
      JVar2.tag = local_50;
      JVar2.u.ptr = local_58.ptr;
      JVar4.tag = 3;
      JVar4.u.ptr = (void *)((ulong)uStack_74 << 0x20);
      JVar4 = JS_CallInternal(ctx,JVar2,(JSValue)(ZEXT816(3) << 0x40),JVar4,1,(JSValue *)&local_48,2
                             );
      if ((0xfffffff4 < (uint)iStack_40) &&
         (iVar3 = *local_48.ptr, *(int *)local_48.ptr = iVar3 + -1, iVar3 < 2)) {
        v.tag = iStack_40;
        v.u.ptr = local_48.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
    }
    if ((0xfffffff4 < (uint)local_60) &&
       (iVar3 = *local_68.ptr, *(int *)local_68.ptr = iVar3 + -1, iVar3 < 2)) {
      v_00.tag = local_60;
      v_00.u.ptr = local_68.ptr;
      __JS_FreeValueRT(ctx->rt,v_00);
    }
    if ((0xfffffff4 < (uint)local_50) &&
       (iVar3 = *local_58.ptr, *(int *)local_58.ptr = iVar3 + -1, iVar3 < 2)) {
      v_01.tag = local_50;
      v_01.u.ptr = local_58.ptr;
      __JS_FreeValueRT(ctx->rt,v_01);
    }
  }
  return JVar4;
}

Assistant:

static JSValue js_promise_resolve_thenable_job(JSContext *ctx,
                                               int argc, JSValueConst *argv)
{
    JSValueConst promise, thenable, then;
    JSValue args[2], res;

#ifdef DUMP_PROMISE
    printf("js_promise_resolve_thenable_job\n");
#endif
    assert(argc == 3);
    promise = argv[0];
    thenable = argv[1];
    then = argv[2];
    if (js_create_resolving_functions(ctx, args, promise) < 0)
        return JS_EXCEPTION;
    res = JS_Call(ctx, then, thenable, 2, (JSValueConst *)args);
    if (JS_IsException(res)) {
        JSValue error = JS_GetException(ctx);
        res = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
    }
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return res;
}